

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stp_bv_performance.cpp
# Opt level: O2

int main(void)

{
  TestMaterial universe;
  TestMaterial TStack_98;
  
  TestMaterial::TestMaterial(&TStack_98,false);
  TestMaterial::initializeUniverse(&TStack_98);
  TestMaterial::TestAnimation(&TStack_98);
  TestMaterial::~TestMaterial(&TStack_98);
  return 0;
}

Assistant:

int main()
{
#ifdef ENABLE_SIGFPE
  feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT);
#endif
  TestMaterial universe = TestMaterial(false); // No other objects than STP-BVs
  universe.initializeUniverse();
  universe.TestAnimation();
  return 0;
}